

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

VRLocation * __thiscall dg::vr::VRLocation::getTreePredecessor(VRLocation *this)

{
  bool bVar1;
  reference ppVVar2;
  long in_RDI;
  VREdge *predEdge;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *__range2;
  VRLocation *treePred;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *in_stack_ffffffffffffffc8;
  VREdge *in_stack_ffffffffffffffd0;
  __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
  local_20;
  long local_18;
  VRLocation *local_10;
  
  local_10 = (VRLocation *)0x0;
  local_18 = in_RDI + 0xf0;
  local_20._M_current =
       (VREdge **)
       std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppVVar2;
    if (in_stack_ffffffffffffffd0->type == TREE) {
      local_10 = in_stack_ffffffffffffffd0->source;
    }
    __gnu_cxx::
    __normal_iterator<dg::vr::VREdge_*const_*,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
    ::operator++(&local_20);
  }
  return local_10;
}

Assistant:

VRLocation &VRLocation::getTreePredecessor() const {
    VRLocation *treePred = nullptr;
    for (VREdge *predEdge : predecessors) {
        if (predEdge->type == EdgeType::TREE)
            treePred = predEdge->source;
    }
    assert(treePred);
    return *treePred;
}